

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  bool bVar2;
  Limit limit;
  int iVar3;
  int64_t iVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t first_byte_or_zero;
  uint uVar11;
  
  pbVar6 = *(byte **)input;
  if (pbVar6 < *(byte **)(input + 8)) {
    uVar10 = (uint)*pbVar6;
    if (-1 < (char)*pbVar6) {
      *(byte **)input = pbVar6 + 1;
      goto LAB_00175acc;
    }
  }
  else {
    uVar10 = 0;
  }
  iVar4 = io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
  uVar10 = (uint)iVar4;
  if (iVar4 < 0) {
    return false;
  }
LAB_00175acc:
  limit = io::CodedInputStream::PushLimit(input,uVar10);
  iVar3 = io::CodedInputStream::BytesUntilLimit(input);
  if (0 < iVar3) {
    uVar10 = field_number << 3;
    do {
      pbVar6 = *(byte **)input;
      if (pbVar6 < *(byte **)(input + 8)) {
        bVar1 = *pbVar6;
        uVar5 = (ulong)bVar1;
        first_byte_or_zero = (uint32_t)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00175b08;
        *(byte **)input = pbVar6 + 1;
      }
      else {
        first_byte_or_zero = 0;
LAB_00175b08:
        uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        if ((long)uVar5 < 0) {
          return false;
        }
      }
      uVar11 = (uint)uVar5;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar2 = (*is_valid)(uVar11), bVar2)) {
        RepeatedField<int>::Add(values,uVar11);
      }
      else {
        pbVar6 = unknown_fields_stream->cur_;
        if ((unknown_fields_stream->impl_).end_ <= pbVar6) {
          pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar6);
        }
        uVar7 = uVar10;
        uVar9 = uVar10;
        if (0x7f < uVar10) {
          do {
            *pbVar6 = (byte)uVar9 | 0x80;
            pbVar6 = pbVar6 + 1;
            bVar2 = 0x3fff < uVar9;
            uVar7 = uVar9 >> 7;
            uVar9 = uVar9 >> 7;
          } while (bVar2);
        }
        *pbVar6 = (byte)uVar7;
        pbVar6 = pbVar6 + 1;
        unknown_fields_stream->cur_ = pbVar6;
        if ((unknown_fields_stream->impl_).end_ <= pbVar6) {
          pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar6);
        }
        if (uVar11 < 0x80) {
          uVar8 = uVar5 & 0xffffffff;
        }
        else {
          uVar8 = uVar5 & 0xffffffff;
          do {
            uVar11 = (uint)uVar5;
            *pbVar6 = (byte)uVar5 | 0x80;
            uVar8 = uVar8 >> 7;
            pbVar6 = pbVar6 + 1;
            uVar5 = uVar8;
          } while (0x3fff < uVar11);
        }
        *pbVar6 = (byte)uVar8;
        unknown_fields_stream->cur_ = pbVar6 + 1;
      }
      iVar3 = io::CodedInputStream::BytesUntilLimit(input);
    } while (0 < iVar3);
  }
  io::CodedInputStream::PopLimit(input,limit);
  return true;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input, int field_number, bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream, RepeatedField<int>* values) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == nullptr || is_valid(value)) {
      values->Add(value);
    } else {
      uint32_t tag = WireFormatLite::MakeTag(field_number,
                                             WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}